

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O0

void __thiscall
cube::net::TcpConnection::ReadUntil(TcpConnection *this,string *delimiter,ReadCallback *cb)

{
  EventLoop *this_00;
  ReadCallback *__f;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  pointer this_01;
  Buffer *local_90;
  enable_shared_from_this<cube::net::TcpConnection> local_88;
  type local_78;
  Task local_40;
  ReadCallback *local_20;
  ReadCallback *cb_local;
  string *delimiter_local;
  TcpConnection *this_local;
  
  local_20 = cb;
  cb_local = (ReadCallback *)delimiter;
  delimiter_local = (string *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)cb);
  if (!bVar1) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/tcp_connection.cpp"
                  ,0x4a,
                  "void cube::net::TcpConnection::ReadUntil(const std::string &, const ReadCallback &)"
                 );
  }
  bVar2 = std::__cxx11::string::empty();
  if (((bVar2 ^ 0xff) & 1) != 0) {
    bVar1 = Closed(this);
    if (!bVar1) {
      pcVar3 = Buffer::Find(&this->m_input_buffer,(string *)cb_local);
      __f = local_20;
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->m_read_delimiter,(string *)cb_local);
        std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>::operator=
                  (&this->m_read_callback,local_20);
        this_01 = std::unique_ptr<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>::
                  operator->(&this->m_eventor);
        bVar1 = Eventor::Reading(this_01);
        if (!bVar1) {
          EnableReading(this);
        }
      }
      else {
        this_00 = this->m_event_loop;
        std::enable_shared_from_this<cube::net::TcpConnection>::shared_from_this(&local_88);
        local_90 = &this->m_input_buffer;
        std::
        bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>const&,std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*>
                  (&local_78,__f,(shared_ptr<cube::net::TcpConnection> *)&local_88,&local_90);
        std::function<void()>::
        function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>,void>
                  ((function<void()> *)&local_40,&local_78);
        EventLoop::Post(this_00,&local_40);
        std::function<void_()>::~function(&local_40);
        std::
        _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>
        ::~_Bind(&local_78);
        std::shared_ptr<cube::net::TcpConnection>::~shared_ptr
                  ((shared_ptr<cube::net::TcpConnection> *)&local_88);
      }
    }
    return;
  }
  __assert_fail("!delimiter.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/tcp_connection.cpp"
                ,0x4b,
                "void cube::net::TcpConnection::ReadUntil(const std::string &, const ReadCallback &)"
               );
}

Assistant:

void TcpConnection::ReadUntil(const std::string &delimiter, const ReadCallback &cb) {
    assert(cb);
    assert(!delimiter.empty());
    if (Closed()) return;
    if (m_input_buffer.Find(delimiter) != NULL) {
        m_event_loop->Post(std::bind(cb, shared_from_this(), &m_input_buffer));
        return;
    }
    m_read_delimiter = delimiter;
    m_read_callback = cb;
    if (!m_eventor->Reading()) {
        EnableReading();
    }
    return;
}